

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

_Bool ipv4_normalize(char *hostname,char *outp,size_t olen)

{
  char *pcVar1;
  ulong uVar2;
  _Bool _Var3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long parts [4];
  char *endp;
  ulong local_58 [5];
  char *local_30;
  
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  if ((byte)(*hostname - 0x3aU) < 0xf6) {
LAB_005b09ec:
    _Var3 = false;
switchD_005b0a76_default:
    return _Var3;
  }
  uVar6 = 0;
LAB_005b0a0b:
  uVar2 = strtoul(hostname,&local_30,0);
  pcVar1 = local_30;
  if (((uVar2 == 0xffffffffffffffff) || (uVar2 >> 0x20 != 0)) || (local_30 == hostname))
  goto LAB_005b09ec;
  local_58[uVar6] = uVar2;
  if (*pcVar1 == '.') {
    if ((int)uVar6 != 3) goto code_r0x005b0a44;
    goto LAB_005b09ec;
  }
  if (*pcVar1 != '\0') goto LAB_005b09ec;
  _Var3 = true;
  uVar2 = local_58[0];
  uVar4 = local_58[1];
  switch(uVar6 & 0xffffffff) {
  case 0:
    uVar6 = local_58[0] & 0xff;
    uVar2 = local_58[0] >> 0x18;
    uVar4 = (ulong)((uint)(local_58[0] >> 0x10) & 0xff);
    uVar5 = (ulong)((uint)(local_58[0] >> 8) & 0xff);
    goto LAB_005b0b5c;
  case 1:
    if (0xffffff < local_58[1] || 0xff < local_58[0]) goto LAB_005b09ec;
    uVar4 = local_58[1] >> 0x10;
    uVar5 = local_58[1] >> 8 & 0xff;
    uVar6 = local_58[1];
    break;
  case 2:
    if (0xffff < local_58[2] || (0xff < local_58[1] || 0xff < local_58[0])) goto LAB_005b09ec;
    uVar5 = local_58[2] >> 8;
    uVar6 = local_58[2];
    break;
  case 3:
    uVar6 = local_58[3];
    uVar5 = local_58[2];
    if ((local_58[3] < 0x100 && local_58[2] < 0x100) && (local_58[1] < 0x100 && local_58[0] < 0x100)
       ) goto LAB_005b0b5c;
    goto LAB_005b09ec;
  default:
    goto switchD_005b0a76_default;
  }
  uVar6 = uVar6 & 0xff;
LAB_005b0b5c:
  curl_msnprintf(outp,0x11,"%u.%u.%u.%u",uVar2,uVar4,uVar5,uVar6);
  return true;
code_r0x005b0a44:
  hostname = pcVar1 + 1;
  uVar6 = uVar6 + 1;
  if ((byte)(pcVar1[1] - 0x3aU) < 0xf6) goto LAB_005b09ec;
  goto LAB_005b0a0b;
}

Assistant:

static bool ipv4_normalize(const char *hostname, char *outp, size_t olen)
{
  bool done = FALSE;
  int n = 0;
  const char *c = hostname;
  unsigned long parts[4] = {0, 0, 0, 0};

  while(!done) {
    char *endp;
    unsigned long l;
    if((*c < '0') || (*c > '9'))
      /* most importantly this doesn't allow a leading plus or minus */
      return FALSE;
    l = strtoul(c, &endp, 0);

    /* overflow or nothing parsed at all */
    if(((l == ULONG_MAX) && (errno == ERANGE)) ||  (endp == c))
      return FALSE;

#if SIZEOF_LONG > 4
    /* a value larger than 32 bits */
    if(l > UINT_MAX)
      return FALSE;
#endif

    parts[n] = l;
    c = endp;

    switch (*c) {
    case '.' :
      if(n == 3)
        return FALSE;
      n++;
      c++;
      break;

    case '\0':
      done = TRUE;
      break;

    default:
      return FALSE;
    }
  }

  /* this is deemed a valid IPv4 numerical address */

  switch(n) {
  case 0: /* a -- 32 bits */
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0] >> 24, (parts[0] >> 16) & 0xff,
              (parts[0] >> 8) & 0xff, parts[0] & 0xff);
    break;
  case 1: /* a.b -- 8.24 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xffffff))
      return FALSE;
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0], (parts[1] >> 16) & 0xff,
              (parts[1] >> 8) & 0xff, parts[1] & 0xff);
    break;
  case 2: /* a.b.c -- 8.8.16 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xff) || (parts[2] > 0xffff))
      return FALSE;
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0], parts[1], (parts[2] >> 8) & 0xff,
              parts[2] & 0xff);
    break;
  case 3: /* a.b.c.d -- 8.8.8.8 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xff) || (parts[2] > 0xff) ||
       (parts[3] > 0xff))
      return FALSE;
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0], parts[1], parts[2], parts[3]);
    break;
  }
  return TRUE;
}